

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<int>::Resize(RepeatedField<int> *this,int new_size,int *value)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  LogMessage *other;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  LogMessage local_78;
  int *local_40;
  LogFinisher local_31;
  
  local_40 = value;
  if (new_size < 0) {
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x506);
    other = internal::LogMessage::operator<<(&local_78,"CHECK failed: (new_size) >= (0): ");
    internal::LogFinisher::operator=(&local_31,other);
    internal::LogMessage::~LogMessage(&local_78);
  }
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    piVar5 = elements(this);
    lVar9 = (long)this->current_size_;
    piVar6 = elements(this);
    auVar4 = _DAT_00342070;
    auVar3 = _DAT_00342060;
    auVar2 = _DAT_00342050;
    if (piVar5 + lVar9 != piVar6 + new_size) {
      iVar1 = *local_40;
      uVar7 = (long)(piVar6 + new_size) + (-4 - (long)(piVar5 + lVar9));
      auVar13._8_4_ = (int)uVar7;
      auVar13._0_8_ = uVar7;
      auVar13._12_4_ = (int)(uVar7 >> 0x20);
      auVar10._0_8_ = uVar7 >> 2;
      auVar10._8_8_ = auVar13._8_8_ >> 2;
      uVar8 = 0;
      auVar10 = auVar10 ^ _DAT_00342070;
      do {
        auVar12._8_4_ = (int)uVar8;
        auVar12._0_8_ = uVar8;
        auVar12._12_4_ = (int)(uVar8 >> 0x20);
        auVar13 = (auVar12 | auVar3) ^ auVar4;
        iVar11 = auVar10._4_4_;
        if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                    iVar11 < auVar13._4_4_) & 1)) {
          piVar5[lVar9 + uVar8] = iVar1;
        }
        if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
            auVar13._12_4_ <= auVar10._12_4_) {
          piVar5[lVar9 + uVar8 + 1] = iVar1;
        }
        auVar13 = (auVar12 | auVar2) ^ auVar4;
        iVar14 = auVar13._4_4_;
        if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar13._0_4_ <= auVar10._0_4_)) {
          piVar5[lVar9 + uVar8 + 2] = iVar1;
          piVar5[lVar9 + uVar8 + 3] = iVar1;
        }
        uVar8 = uVar8 + 4;
      } while (((uVar7 >> 2) + 4 & 0xfffffffffffffffc) != uVar8);
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}